

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::SetEnum
          (ExtensionSet *this,int number,FieldType type,int value,FieldDescriptor *descriptor)

{
  byte bVar1;
  Extension *pEVar2;
  string *psVar3;
  size_type sVar4;
  undefined8 uVar5;
  pointer pcVar6;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar7;
  anon_enum_32 local_34;
  anon_enum_32 local_30 [4];
  
  pVar7 = Insert(this,number);
  pEVar2 = pVar7.first;
  pEVar2->descriptor = descriptor;
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_30[0] = pEVar2->is_repeated ^ OPTIONAL_FIELD;
    local_34 = OPTIONAL_FIELD;
    psVar3 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                       (local_30,&local_34,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                       );
    if (psVar3 == (string *)0x0) {
      local_30[0] = anon_unknown_58::cpp_type(pEVar2->type);
      local_34 = 8;
      psVar3 = absl::lts_20240722::log_internal::
               Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                         (local_30,&local_34,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
      if (psVar3 == (string *)0x0) {
        bVar1 = pEVar2->field_0xa;
        goto LAB_0012feb5;
      }
    }
    pcVar6 = (psVar3->_M_dataplus)._M_p;
    sVar4 = psVar3->_M_string_length;
    uVar5 = 0x1f0;
  }
  else {
    pEVar2->type = type;
    local_30[0] = anon_unknown_58::cpp_type(type);
    local_34 = 8;
    psVar3 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                       (local_30,&local_34,
                        "cpp_type(extension->type) == WireFormatLite::CPPTYPE_ENUM");
    if (psVar3 == (string *)0x0) {
      pEVar2->is_repeated = false;
      bVar1 = pEVar2->field_0xa & 0xfe;
LAB_0012feb5:
      pEVar2->field_0xa = bVar1 & 0xfd;
      (pEVar2->field_0).enum_value = value;
      return;
    }
    pcVar6 = (psVar3->_M_dataplus)._M_p;
    sVar4 = psVar3->_M_string_length;
    uVar5 = 0x1ec;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
             ,uVar5,sVar4,pcVar6);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_30);
}

Assistant:

void ExtensionSet::SetEnum(int number, FieldType type, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = false;
    extension->is_pointer = false;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, ENUM);
  }
  extension->is_cleared = false;
  extension->enum_value = value;
}